

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

void __thiscall
LongReadsMapper::map_reads_to_best_nodes
          (LongReadsMapper *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *readIDs)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  void *this_00;
  size_type sVar5;
  const_reference pvVar6;
  size_type sVar7;
  rep rVar8;
  type_conflict tVar9;
  LongReadsMapper *this_01;
  const_iterator __position;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  __first;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  __last;
  ostream *poVar10;
  ostream *this_02;
  ulong uVar11;
  long *in_RDI;
  reference rVar12;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *threadm;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *__range1;
  time_point t3;
  time_point t2;
  time_point t1;
  uint64_t i;
  vector<bool,_std::allocator<bool>_> kmer_in_assembly;
  time_point t0;
  uint32_t readID;
  type ttoal;
  type techain;
  type tichain;
  type tkhits;
  time_point t;
  vector<chain,_std::allocator<chain>_> best_window_chain;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  char *query_sequence_ptr;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  ReadSequenceBuffer sequenceGetter;
  value_type *private_results;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  StreamKmerFactory skf;
  uint64_t multi_matches;
  uint64_t single_matches;
  uint64_t no_matches;
  uint32_t num_reads_done;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  thread_mappings;
  shared_ptr<SatKmerIndex> skindex;
  shared_ptr<NKmerIndex> nkindex;
  undefined7 in_stack_fffffffffffff8f8;
  uint8_t in_stack_fffffffffffff8ff;
  NKmerIndex *in_stack_fffffffffffff900;
  LongReadsDatastore *in_stack_fffffffffffff908;
  ReadSequenceBuffer *in_stack_fffffffffffff910;
  char *in_stack_fffffffffffff918;
  StreamKmerFactory *in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff928;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  *in_stack_fffffffffffff968;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *in_stack_fffffffffffff970;
  SatKmerIndex *in_stack_fffffffffffff978;
  LongReadsMapper *in_stack_fffffffffffff980;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  *in_stack_fffffffffffff988;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *in_stack_fffffffffffff990;
  NKmerIndex *in_stack_fffffffffffff998;
  LongReadsMapper *in_stack_fffffffffffff9a0;
  undefined8 in_stack_fffffffffffff9a8;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  vector<chain,_std::allocator<chain>_> *in_stack_fffffffffffff9c0;
  uint64_t in_stack_fffffffffffff9d8;
  ReadSequenceBuffer *in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffffa18;
  type in_stack_fffffffffffffa20;
  type in_stack_fffffffffffffa28;
  type in_stack_fffffffffffffa30;
  type in_stack_fffffffffffffa38;
  uint readID_00;
  __normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
  local_478;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *local_470;
  undefined4 local_464;
  rep local_460;
  duration<long,_std::ratio<1L,_1000L>_> local_458;
  undefined4 local_44c;
  rep local_448;
  duration<long,_std::ratio<1L,_1000L>_> local_440;
  undefined4 local_434;
  rep local_430;
  duration<long,_std::ratio<1L,_1000L>_> local_428;
  duration<long,_std::ratio<1L,_1000L>_> local_420;
  rep local_418;
  rep local_410;
  rep local_408;
  rep local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  reference local_3e0;
  ulong local_3d0;
  undefined8 local_398;
  uint local_38c;
  rep local_388;
  rep local_380;
  rep local_378;
  rep local_370;
  undefined8 local_368;
  int in_stack_fffffffffffffcc0;
  uint8_t in_stack_fffffffffffffcc7;
  SequenceDistanceGraph *in_stack_fffffffffffffcc8;
  NKmerIndex *in_stack_fffffffffffffcd0;
  uint8_t in_stack_fffffffffffffce6;
  uint8_t in_stack_fffffffffffffce7;
  SequenceDistanceGraph *in_stack_fffffffffffffce8;
  SatKmerIndex *in_stack_fffffffffffffcf0;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  local_2c0 [24];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  uint local_60;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  local_58 [3];
  
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::clear
            ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)0x3f4920);
  std::shared_ptr<NKmerIndex>::shared_ptr((shared_ptr<NKmerIndex> *)0x3f492d);
  std::shared_ptr<SatKmerIndex>::shared_ptr((shared_ptr<SatKmerIndex> *)0x3f493a);
  if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
    operator_new(0x50);
    NKmerIndex::NKmerIndex
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc7,
               in_stack_fffffffffffffcc0);
    std::__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<NKmerIndex>
              ((__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffff910,
               (NKmerIndex *)in_stack_fffffffffffff908);
  }
  else {
    operator_new(0x38);
    SatKmerIndex::SatKmerIndex
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce7,
               in_stack_fffffffffffffce6);
    std::__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<SatKmerIndex>
              ((__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffff910,
               (SatKmerIndex *)in_stack_fffffffffffff908);
  }
  poVar3 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff928 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff928 >> 0x18,0));
  poVar3 = std::operator<<(poVar3,"Index created");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  omp_get_max_threads();
  std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>::allocator
            ((allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_> *)0x3f4adc)
  ;
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::vector((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
            *)in_stack_fffffffffffff920,(size_type)in_stack_fffffffffffff918,
           (allocator_type *)in_stack_fffffffffffff910);
  std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>::~allocator
            ((allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_> *)0x3f4b08)
  ;
  local_60 = 0;
  local_68 = 0;
  local_70 = 0;
  local_78 = 0;
  StreamKmerFactory::StreamKmerFactory
            ((StreamKmerFactory *)in_stack_fffffffffffff900,in_stack_fffffffffffff8ff);
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  vector((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> *
         )0x3f4b5f);
  iVar2 = omp_get_thread_num();
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::operator[](local_58,(long)iVar2);
  ReadSequenceBuffer::ReadSequenceBuffer
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908,(size_t)in_stack_fffffffffffff900,
             CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)0x3f4bc1);
  std::vector<Node,_std::allocator<Node>_>::size
            ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40));
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3f4bf5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff920,
             (size_type)in_stack_fffffffffffff918,(allocator_type *)in_stack_fffffffffffff910);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3f4c21);
  std::vector<chain,_std::allocator<chain>_>::vector
            ((vector<chain,_std::allocator<chain>_> *)0x3f4c2e);
  local_368 = std::chrono::_V2::system_clock::now();
  local_370 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff908,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff900);
  local_378 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff908,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff900);
  local_380 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff908,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff900);
  local_388 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff908,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff900);
  local_38c = 1;
  do {
    uVar11 = (ulong)local_38c;
    sVar4 = LongReadsDatastore::size((LongReadsDatastore *)0x3f4d0e);
    if (sVar4 < uVar11) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Thread #");
      iVar2 = omp_get_thread_num();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3," times: ");
      local_420.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
      rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_420);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar8);
      poVar3 = std::operator<<(poVar3," total, ");
      local_428.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
      rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_428);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar8);
      poVar3 = std::operator<<(poVar3," (");
      local_434 = 100;
      local_430 = (rep)std::chrono::operator*
                                 ((int *)CONCAT17(in_stack_fffffffffffff8ff,
                                                  in_stack_fffffffffffff8f8),
                                  (duration<long,_std::ratio<1L,_1000000000L>_> *)0x3f5523);
      tVar9 = std::chrono::operator/
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff910,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff908);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,tVar9);
      poVar3 = std::operator<<(poVar3,"%)kmer-hit search, ");
      local_440.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
      rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_440);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar8);
      this_01 = (LongReadsMapper *)std::operator<<(poVar3," (");
      local_44c = 100;
      local_448 = (rep)std::chrono::operator*
                                 ((int *)CONCAT17(in_stack_fffffffffffff8ff,
                                                  in_stack_fffffffffffff8f8),
                                  (duration<long,_std::ratio<1L,_1000000000L>_> *)0x3f5634);
      tVar9 = std::chrono::operator/
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff910,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff908);
      poVar3 = (ostream *)std::ostream::operator<<(this_01,tVar9);
      poVar3 = std::operator<<(poVar3,"%)internal chaining, ");
      __position._M_current =
           (LongReadMapping *)
           std::chrono::
           duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                     ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                      CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
      local_458.__r = (rep)__position._M_current;
      __first._M_current =
           (LongReadMapping *)std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_458)
      ;
      __last._M_current =
           (LongReadMapping *)std::ostream::operator<<(poVar3,(long)__first._M_current);
      poVar3 = std::operator<<((ostream *)__last._M_current," (");
      local_464 = 100;
      local_460 = (rep)std::chrono::operator*
                                 ((int *)CONCAT17(in_stack_fffffffffffff8ff,
                                                  in_stack_fffffffffffff8f8),
                                  (duration<long,_std::ratio<1L,_1000000000L>_> *)0x3f571e);
      tVar9 = std::chrono::operator/
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff910,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff908);
      poVar10 = (ostream *)std::ostream::operator<<(poVar3,tVar9);
      this_02 = std::operator<<(poVar10,"%)external chaining");
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
      std::vector<chain,_std::allocator<chain>_>::~vector
                ((vector<chain,_std::allocator<chain>_> *)in_stack_fffffffffffff910);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff910)
      ;
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 *)in_stack_fffffffffffff910);
      ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)in_stack_fffffffffffff900);
      std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
      ::~vector((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                 *)in_stack_fffffffffffff910);
      local_470 = local_58;
      local_478._M_current =
           (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
           std::
           vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           ::begin((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
      std::
      vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ::end((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
                            *)in_stack_fffffffffffff900,
                           (__normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
        ::operator*(&local_478);
        in_stack_fffffffffffff910 = (ReadSequenceBuffer *)(in_RDI + 6);
        std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                  ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                   CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
        __gnu_cxx::
        __normal_iterator<LongReadMapping_const*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>
        ::__normal_iterator<LongReadMapping*>
                  ((__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                    *)in_stack_fffffffffffff900,
                   (__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
        std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin
                  ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                   CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
        std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                  ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                   CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
        std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
        insert<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,void>
                  ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)poVar3,__position,
                   __first,__last);
        __gnu_cxx::
        __normal_iterator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_*,_std::vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>_>
        ::operator++(&local_478);
      }
      poVar3 = sdglib::OutputLog((LogLevels)((ulong)poVar10 >> 0x20),SUB81((ulong)poVar10 >> 0x18,0)
                                );
      poVar3 = std::operator<<(poVar3,"Updating mapping indexes");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      update_indexes(this_01);
      std::
      vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ::~vector((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                 *)in_stack_fffffffffffff910);
      std::shared_ptr<SatKmerIndex>::~shared_ptr((shared_ptr<SatKmerIndex> *)0x3f598c);
      std::shared_ptr<NKmerIndex>::~shared_ptr((shared_ptr<NKmerIndex> *)0x3f5999);
      return;
    }
    local_398 = std::chrono::_V2::system_clock::now();
    local_60 = local_60 + 1;
    if (local_60 % 10000 == 0) {
      poVar3 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff928 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffff928 >> 0x18,0));
      poVar3 = std::operator<<(poVar3,"Thread #");
      iVar2 = omp_get_thread_num();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3," processing its read #");
      this_00 = (void *)std::ostream::operator<<(poVar3,local_60);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::empty((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)0x3f4ebc);
    if (bVar1) {
LAB_003f4ef2:
      pvVar6 = std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::operator[]
                         ((vector<ReadPosSize,_std::allocator<ReadPosSize>_> *)(in_RDI[5] + 0x10),
                          (ulong)local_38c);
      if ((uint)((int)in_RDI[2] << 1) <= pvVar6->record_size) {
        ReadSequenceBuffer::get_read_sequence(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        std::
        vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
        clear((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               *)0x3f4f6e);
        StreamKmerFactory::produce_all_kmers
                  (in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                   (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    *)in_stack_fffffffffffff910);
        sVar7 = std::
                vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                ::size(local_2c0);
        if ((ulong)(long)((int)in_RDI[2] << 1) <= sVar7) {
          if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
            std::
            vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ::size(local_2c0);
            std::allocator<bool>::allocator((allocator<bool> *)0x3f5023);
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff910,
                       (size_type)in_stack_fffffffffffff908,
                       (allocator_type *)in_stack_fffffffffffff900);
            std::allocator<bool>::~allocator((allocator<bool> *)0x3f504f);
            local_3d0 = 0;
            while( true ) {
              uVar11 = local_3d0;
              sVar7 = std::
                      vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      ::size(local_2c0);
              if (sVar7 <= uVar11) break;
              std::__shared_ptr_access<NKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<NKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3f5099);
              std::
              vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
              ::operator[](local_2c0,local_3d0);
              bVar1 = NKmerIndex::filter(in_stack_fffffffffffff900,
                                         CONCAT17(in_stack_fffffffffffff8ff,
                                                  in_stack_fffffffffffff8f8));
              rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff920,
                                  (size_type)in_stack_fffffffffffff918);
              local_3e0 = rVar12;
              std::_Bit_reference::operator=(&local_3e0,bVar1);
              local_3d0 = local_3d0 + 1;
            }
            std::__shared_ptr_access<NKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<NKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_fffffffffffff900);
            get_all_kmer_matches
                      (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,in_stack_fffffffffffff990
                       ,in_stack_fffffffffffff988,
                       (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff980);
            std::vector<bool,_std::allocator<bool>_>::~vector
                      ((vector<bool,_std::allocator<bool>_> *)0x3f51da);
          }
          else {
            std::__shared_ptr_access<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )in_stack_fffffffffffff900);
            get_sat_kmer_matches
                      (in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff970
                       ,in_stack_fffffffffffff968);
          }
          local_3e8 = std::chrono::_V2::system_clock::now();
          std::
          vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
          size(local_2c0);
          window_internal_chaining
                    (in_stack_fffffffffffff9c0,(uint32_t)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                     in_stack_fffffffffffff9b0,(int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
          local_3f0 = std::chrono::_V2::system_clock::now();
          readID_00 = local_38c;
          std::
          vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
          size(local_2c0);
          window_external_chaining
                    (readID_00,in_stack_fffffffffffffa38.__r,
                     (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                     in_stack_fffffffffffffa30.__r,
                     (vector<chain,_std::allocator<chain>_> *)in_stack_fffffffffffffa28.__r,
                     (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      *)in_stack_fffffffffffffa20.__r,
                     (int)((ulong)in_stack_fffffffffffffa18 >> 0x20));
          local_3f8 = std::chrono::_V2::system_clock::now();
          in_stack_fffffffffffffa38 =
               std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff908,
                          (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff900);
          local_400 = in_stack_fffffffffffffa38.__r;
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff900,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
          in_stack_fffffffffffffa30 =
               std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff908,
                          (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff900);
          local_408 = in_stack_fffffffffffffa30.__r;
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff900,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
          in_stack_fffffffffffffa28 =
               std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff908,
                          (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff900);
          local_410 = in_stack_fffffffffffffa28.__r;
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff900,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
          in_stack_fffffffffffffa20 =
               std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff908,
                          (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff900);
          local_418 = in_stack_fffffffffffffa20.__r;
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff900,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
        }
      }
    }
    else {
      sVar5 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)in_stack_fffffffffffff900,
                      (key_type *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8));
      if (sVar5 != 0) goto LAB_003f4ef2;
    }
    local_38c = local_38c + 1;
  } while( true );
}

Assistant:

void LongReadsMapper::map_reads_to_best_nodes(const std::unordered_set<uint32_t> &readIDs) {
    mappings.clear();
    std::shared_ptr<NKmerIndex> nkindex;
    std::shared_ptr<SatKmerIndex> skindex;
    if (sat_kmer_index) skindex.reset(new SatKmerIndex(sg,k,max_index_freq));
    else nkindex.reset(new NKmerIndex(sg,k,max_index_freq));
    sdglib::OutputLog() << "Index created" << std::endl;
    std::vector<std::vector<LongReadMapping>> thread_mappings(omp_get_max_threads());
    uint32_t num_reads_done(0);
    uint64_t no_matches(0),single_matches(0),multi_matches(0);
#pragma omp parallel default(none) shared(thread_mappings,nkindex,skindex,no_matches,single_matches,multi_matches,num_reads_done,readIDs) shared(std::cout)
    {
        StreamKmerFactory skf(k);
        std::vector<std::pair<bool, uint64_t>> read_kmers;

        auto & private_results=thread_mappings[omp_get_thread_num()];
        ReadSequenceBuffer sequenceGetter(datastore);
        std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
        const char * query_sequence_ptr;

        std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);
        std::vector<chain> best_window_chain;
        auto t=std::chrono::high_resolution_clock::now();
        auto tkhits=t-t,tichain=t-t,techain=t-t,ttoal=t-t;

#pragma omp for schedule(static,200) reduction(+:no_matches,single_matches,multi_matches,num_reads_done)
        for (uint32_t readID = 1; readID <= datastore.size(); ++readID) {
        //for (uint32_t readID = 598822; readID < 598823; ++readID) {
        //for (uint32_t readID = 3024; readID < 3024; ++readID) {

            auto t0=std::chrono::high_resolution_clock::now();
            if (++num_reads_done%10000 == 0) {
                sdglib::OutputLog() << "Thread #"<<omp_get_thread_num() <<" processing its read #" << num_reads_done << std::endl;
            }

            if ((!readIDs.empty() and readIDs.count(readID)==0 /*Read not in selected set*/)) {
                continue;
            }
            if (datastore.read_to_fileRecord[readID].record_size< 2 * min_size ) continue;
            //========== 1. Get read sequence, kmerise, get all matches ==========
            query_sequence_ptr = sequenceGetter.get_read_sequence(readID);
            read_kmers.clear();
            skf.produce_all_kmers(query_sequence_ptr, read_kmers);

            if ( read_kmers.size()< 2 * min_size) {
                continue;
            }

            // Create a vector for the lookup of read_kmers in the filter, then sort the ones that are in the filter
            // generate_matches using a sorted version which will make the lookups faster

            // sort them back in the order they came out of the reads

            if (sat_kmer_index) {
                get_sat_kmer_matches(*skindex,node_matches, read_kmers);
            } else {
                std::vector<bool> kmer_in_assembly(read_kmers.size());

                for (uint64_t i = 0; i < read_kmers.size(); ++i) {
                    kmer_in_assembly[i] = nkindex->filter(read_kmers[i].second);
                }
                get_all_kmer_matches(*nkindex, node_matches, read_kmers, kmer_in_assembly);
            }

            //========== 2. Find best chaining in fixed windows ==========
            //std::cout<<"Internal chaining for "<<readID<<std::endl;
            auto t1=std::chrono::high_resolution_clock::now();
            window_internal_chaining(best_window_chain,read_kmers.size(),node_matches,100);
            //std::cout<<"Best window matches for read #"<<readID<<std::endl;
//            for (auto bwc:best_window_chain) {
//                std::cout<<"Node: "<<bwc.node<<" Delta: "<<bwc.delta<<" Score: "<<bwc.score<<std::endl;
//            }
//            std::cout<<std::endl;
            //std::cout<<"External chaining for "<<readID<<std::endl;
            auto t2=std::chrono::high_resolution_clock::now();
            window_external_chaining(readID,read_kmers.size(),private_results,best_window_chain,node_matches,100);
//            for (auto r:private_results){
//                std::cout<<r<<std::endl;
//            }
            auto t3=std::chrono::high_resolution_clock::now();
            //private_results.insert(private_results.end(),fblocks.begin(),fblocks.end());
            tkhits+=t1-t0;
            tichain+=t2-t1;
            techain+=t3-t2;
            ttoal+=t3-t0;
        }
#pragma omp critical
        std::cout<<"Thread #"<<omp_get_thread_num()<<" times: "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(ttoal).count()<<" total, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(tkhits).count()<<" ("<<100*tkhits/ttoal<<"%)kmer-hit search, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(tichain).count()<<" ("<<100*tichain/ttoal<<"%)internal chaining, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(techain).count()<<" ("<<100*techain/ttoal<<"%)external chaining"<<std::endl;
    }
    //TODO: report read and win coverage by winners vs. by loosers
//    sdglib::OutputLog()<<"Read window results:    "<<window_low_score<<" low score    "<<window_close_second<<" close second    "<<window_hit<<" hits"<<std::endl;
//    sdglib::OutputLog()<<"Read results:    "<<no_matches<<" no match    "<<single_matches<<" single match    "<<multi_matches<<" multi matches"<<std::endl;
    for (auto & threadm : thread_mappings) {
        mappings.insert(mappings.end(),threadm.begin(),threadm.end());
    }
    sdglib::OutputLog() << "Updating mapping indexes" <<std::endl;
    update_indexes();
}